

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserInterface.cpp
# Opt level: O2

void __thiscall
TextField::TextField
          (TextField *this,string *labelText,string *initialFieldText,Color *textColor,uint charSize
          ,float x,float y,Color *fillColor,Color *outlineColor,int maxCharacters,bool isEditable)

{
  Text *this_00;
  Text *this_01;
  int iVar1;
  RectangleShape *pRVar2;
  Font *pFVar3;
  Vector2f VVar4;
  FloatRect FVar5;
  undefined1 local_c0 [32];
  RectangleShape *local_a0;
  Transformable *local_98;
  RectangleShape *local_90;
  string *local_88;
  locale local_80 [8];
  string maxSizeField;
  string local_50;
  
  local_88 = initialFieldText;
  UIComponent::UIComponent(&this->super_UIComponent);
  (this->super_UIComponent).super_Drawable._vptr_Drawable = (_func_int **)&PTR__TextField_001c5200;
  local_98 = &(this->super_UIComponent).super_Transformable;
  (this->super_UIComponent).super_Transformable._vptr_Transformable =
       (_func_int **)&PTR__TextField_001c5238;
  this_00 = &this->label;
  sf::Text::Text(this_00);
  this_01 = &this->field;
  sf::Text::Text(this_01);
  maxSizeField._M_dataplus._M_p = (pointer)0x0;
  sf::RectangleShape::RectangleShape(&this->background,(Vector2f *)&maxSizeField);
  local_a0 = &this->caret;
  maxSizeField._M_dataplus._M_p = (pointer)0x0;
  local_90 = &this->background;
  sf::RectangleShape::RectangleShape(local_a0,(Vector2f *)&maxSizeField);
  pFVar3 = Board::getFont();
  sf::Text::setFont(this_00,pFVar3);
  std::locale::locale((locale *)local_c0);
  sf::String::String((String *)&maxSizeField,labelText,(locale *)local_c0);
  sf::Text::setString(this_00,(String *)&maxSizeField);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  ~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)&maxSizeField);
  std::locale::~locale((locale *)local_c0);
  sf::Text::setFillColor(this_00,textColor);
  sf::Text::setCharacterSize(this_00,charSize);
  sf::Transformable::setPosition(&(this->label).super_Transformable,0.0,0.0);
  maxSizeField._M_dataplus._M_p = (pointer)&maxSizeField.field_2;
  std::__cxx11::string::_M_construct((ulong)&maxSizeField,(char)maxCharacters);
  pFVar3 = Board::getFont();
  sf::Text::setFont(this_01,pFVar3);
  std::locale::locale((locale *)&local_50);
  sf::String::String((String *)local_c0,&maxSizeField,(locale *)&local_50);
  sf::Text::setString(this_01,(String *)local_c0);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  ~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)local_c0);
  std::locale::~locale((locale *)&local_50);
  pRVar2 = local_90;
  sf::Text::setFillColor(this_01,textColor);
  sf::Text::setCharacterSize(this_01,charSize);
  FVar5 = sf::Text::getLocalBounds(this_00);
  sf::Transformable::setPosition(&(this->field).super_Transformable,FVar5.width + 5.0,0.0);
  FVar5 = sf::Text::getLocalBounds(this_01);
  local_c0._0_4_ = FVar5.width + 10.0;
  local_c0._4_4_ = (float)charSize * 1.5;
  sf::RectangleShape::setSize(pRVar2,(Vector2f *)local_c0);
  sf::Shape::setFillColor(&pRVar2->super_Shape,fillColor);
  sf::Shape::setOutlineColor(&pRVar2->super_Shape,outlineColor);
  sf::Shape::setOutlineThickness(&pRVar2->super_Shape,-2.0);
  FVar5 = sf::Text::getLocalBounds(this_00);
  sf::Transformable::setPosition
            (&(this->background).super_Shape.super_Transformable,FVar5.width,0.0);
  pRVar2 = local_a0;
  iVar1 = (int)local_88->_M_string_length;
  if (maxCharacters <= iVar1) {
    iVar1 = maxCharacters;
  }
  local_c0._4_4_ = (float)charSize * 1.5 + -4.0;
  this->caretPosition = iVar1;
  local_c0._0_4_ = 2.0;
  sf::RectangleShape::setSize(local_a0,(Vector2f *)local_c0);
  sf::Shape::setFillColor(&pRVar2->super_Shape,textColor);
  VVar4 = sf::Text::findCharacterPos(this_01,(long)this->caretPosition);
  sf::Transformable::setPosition(&(this->caret).super_Shape.super_Transformable,VVar4.x,2.0);
  std::__cxx11::string::substr((ulong)&local_50,(ulong)local_88);
  std::locale::locale(local_80);
  sf::String::String((String *)local_c0,&local_50,local_80);
  sf::Text::setString(this_01,(String *)local_c0);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  ~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)local_c0);
  std::locale::~locale(local_80);
  std::__cxx11::string::~string((string *)&local_50);
  sf::Transformable::setPosition(local_98,x,y);
  this->maxCharacters = maxCharacters;
  this->selected = false;
  this->isEditable = isEditable;
  std::__cxx11::string::~string((string *)&maxSizeField);
  return;
}

Assistant:

TextField::TextField(const string& labelText, const string& initialFieldText, const Color& textColor, unsigned int charSize, float x, float y, const Color& fillColor, const Color& outlineColor, int maxCharacters, bool isEditable) {
    label.setFont(Board::getFont());
    label.setString(labelText);
    label.setFillColor(textColor);
    label.setCharacterSize(charSize);
    label.setPosition(0.0f, 0.0f);
    
    string maxSizeField(maxCharacters, ' ');
    field.setFont(Board::getFont());
    field.setString(maxSizeField);
    field.setFillColor(textColor);
    field.setCharacterSize(charSize);
    field.setPosition(label.getLocalBounds().width + 5.0f, 0.0f);
    
    background.setSize(Vector2f(field.getLocalBounds().width + 10.0f, charSize * 1.5f));
    background.setFillColor(fillColor);
    background.setOutlineColor(outlineColor);
    background.setOutlineThickness(-2.0f);
    background.setPosition(label.getLocalBounds().width, 0.0f);
    
    caretPosition = min(maxCharacters, static_cast<int>(initialFieldText.length()));
    caret.setSize(Vector2f(2.0f, charSize * 1.5f - 4.0f));
    caret.setFillColor(textColor);
    caret.setPosition(field.findCharacterPos(caretPosition).x, 2.0f);
    field.setString(initialFieldText.substr(0, maxCharacters));
    
    setPosition(x, y);
    this->maxCharacters = maxCharacters;
    selected = false;
    this->isEditable = isEditable;
}